

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushStyleVar(ImGuiStyleVar idx,ImVec2 *val)

{
  int *piVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  ImGuiStyleMod *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiStyleMod *__dest;
  int iVar7;
  int iVar8;
  
  pIVar6 = GImGui;
  if (0xb < (uint)idx) {
    __assert_fail("idx >= 0 && idx < ImGuiStyleVar_Count_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x1259,"const ImGuiStyleVarInfo *GetStyleVarInfo(ImGuiStyleVar)");
  }
  if (GStyleVarInfo[(uint)idx].Type == ImGuiDataType_Float2) {
    uVar3 = GStyleVarInfo[(uint)idx].Offset;
    uVar2 = *(undefined8 *)
             ((long)&((ImGuiStyle *)((GImGui->Style).Colors + -8))->Alpha + (ulong)uVar3);
    iVar8 = (GImGui->StyleModifiers).Size;
    iVar4 = (GImGui->StyleModifiers).Capacity;
    if (iVar8 == iVar4) {
      iVar8 = iVar8 + 1;
      if (iVar4 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar4 / 2 + iVar4;
      }
      if (iVar8 < iVar7) {
        iVar8 = iVar7;
      }
      if (iVar4 < iVar8) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest = (ImGuiStyleMod *)(*(pIVar6->IO).MemAllocFn)((long)iVar8 * 0xc);
        pIVar5 = (pIVar6->StyleModifiers).Data;
        if (pIVar5 != (ImGuiStyleMod *)0x0) {
          memcpy(__dest,pIVar5,(long)(pIVar6->StyleModifiers).Size * 0xc);
        }
        pIVar5 = (pIVar6->StyleModifiers).Data;
        if (pIVar5 != (ImGuiStyleMod *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pIVar5);
        (pIVar6->StyleModifiers).Data = __dest;
        (pIVar6->StyleModifiers).Capacity = iVar8;
      }
    }
    pIVar5 = (pIVar6->StyleModifiers).Data;
    iVar8 = (pIVar6->StyleModifiers).Size;
    (pIVar6->StyleModifiers).Size = iVar8 + 1;
    pIVar5[iVar8].VarIdx = idx;
    pIVar5[iVar8].field_1.BackupInt[0] = (int)uVar2;
    pIVar5[iVar8].field_1.BackupInt[1] = (int)((ulong)uVar2 >> 0x20);
    *(ImVec2 *)((long)&((ImGuiStyle *)((pIVar6->Style).Colors + -8))->Alpha + (ulong)uVar3) = *val;
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                ,0x1274,"void ImGui::PushStyleVar(ImGuiStyleVar, const ImVec2 &)");
}

Assistant:

static const ImGuiStyleVarInfo* GetStyleVarInfo(ImGuiStyleVar idx)
{
    IM_ASSERT(idx >= 0 && idx < ImGuiStyleVar_Count_);
    return &GStyleVarInfo[idx];
}